

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uint ghc::filesystem::detail::consumeUtf8Fragment(uint state,uint8_t fragment,uint32_t *codepoint)

{
  uint local_28;
  uint local_24;
  uint local_20;
  uint8_t category;
  uint32_t *codepoint_local;
  uint8_t fragment_local;
  uint state_local;
  
  if (fragment < 0x80) {
    local_20 = 0;
  }
  else {
    local_20 = consumeUtf8Fragment::utf8_state_info[(int)((int)(uint)fragment >> 3 & 0xf)] >>
               ((fragment & 7) << 2) & 0xf;
  }
  if (state == 0) {
    local_24 = 0xffU >> (sbyte)local_20 & (uint)fragment;
  }
  else {
    local_24 = *codepoint << 6 | fragment & 0x3f;
  }
  *codepoint = local_24;
  if (state == 8) {
    local_28 = 8;
  }
  else {
    local_28 = consumeUtf8Fragment::utf8_state_info[(int)(local_20 + 0x10)] >>
               ((byte)(state << 2) & 0x1f) & 0xf;
  }
  return local_28;
}

Assistant:

GHC_INLINE unsigned consumeUtf8Fragment(const unsigned state, const uint8_t fragment, uint32_t& codepoint)
{
    static const uint32_t utf8_state_info[] = {
        // encoded states
        0x11111111u, 0x11111111u, 0x77777777u, 0x77777777u, 0x88888888u, 0x88888888u, 0x88888888u, 0x88888888u, 0x22222299u, 0x22222222u, 0x22222222u, 0x22222222u, 0x3333333au, 0x33433333u, 0x9995666bu, 0x99999999u,
        0x88888880u, 0x22818108u, 0x88888881u, 0x88888882u, 0x88888884u, 0x88888887u, 0x88888886u, 0x82218108u, 0x82281108u, 0x88888888u, 0x88888883u, 0x88888885u, 0u,          0u,          0u,          0u,
    };
    uint8_t category = fragment < 128 ? 0 : (utf8_state_info[(fragment >> 3) & 0xf] >> ((fragment & 7) << 2)) & 0xf;
    codepoint = (state ? (codepoint << 6) | (fragment & 0x3fu) : (0xffu >> category) & fragment);
    return state == S_RJCT ? static_cast<unsigned>(S_RJCT) : static_cast<unsigned>((utf8_state_info[category + 16] >> (state << 2)) & 0xf);
}